

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

cmCommand * __thiscall
cmCTestSetDirectoryPropertiesCommand::Clone(cmCTestSetDirectoryPropertiesCommand *this)

{
  cmCTestSetDirectoryPropertiesCommand *this_00;
  cmCTestSetDirectoryPropertiesCommand *c;
  cmCTestSetDirectoryPropertiesCommand *this_local;
  
  this_00 = (cmCTestSetDirectoryPropertiesCommand *)operator_new(0x38);
  cmCTestSetDirectoryPropertiesCommand(this_00);
  this_00->TestHandler = this->TestHandler;
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestSetDirectoryPropertiesCommand* c =
      new cmCTestSetDirectoryPropertiesCommand;
    c->TestHandler = this->TestHandler;
    return c;
  }